

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int64_t atol8(char *p,size_t char_cnt)

{
  int digit;
  int64_t l;
  size_t char_cnt_local;
  char *p_local;
  
  l = 0;
  char_cnt_local = char_cnt;
  for (p_local = p; ((char_cnt_local != 0 && ('/' < *p_local)) && (*p_local < '8'));
      p_local = p_local + 1) {
    l = (long)(*p_local + -0x30) | l << 3;
    char_cnt_local = char_cnt_local - 1;
  }
  return l;
}

Assistant:

static int64_t
atol8(const char *p, unsigned char_cnt)
{
	int64_t l;
	int digit;

	l = 0;
	while (char_cnt-- > 0) {
		if (*p >= '0' && *p <= '7')
			digit = *p - '0';
		else
			return (l);
		p++;
		l <<= 3;
		l |= digit;
	}
	return (l);
}